

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMap.c
# Opt level: O2

Hop_Obj_t * Nwk_NodeIfToHop(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj)

{
  Vec_Ptr_t *vVisited;
  uint uVar1;
  If_Obj_t *pIVar2;
  Hop_Obj_t *pHVar3;
  undefined8 *puVar4;
  int i;
  ulong uVar5;
  
  uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
  if (uVar1 < 0x2000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkMap.c"
                  ,0xf3,"Hop_Obj_t *Nwk_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
  }
  for (uVar5 = 0; uVar5 < uVar1 >> 0x18; uVar5 = uVar5 + 1) {
    pIVar2 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar5 * 4));
    if (pIVar2 == (If_Obj_t *)0x0) break;
    pHVar3 = Hop_IthVar(pHopMan,(int)uVar5);
    *(Hop_Obj_t **)&pIVar2->CutBest = pHVar3;
    uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
  }
  vVisited = pIfMan->vTemp;
  vVisited->nSize = 0;
  pHVar3 = Nwk_NodeIfToHop2_rec(pHopMan,pIfMan,pIfObj,vVisited);
  if (pHVar3 == (Hop_Obj_t *)0x1) {
    puts("Nwk_NodeIfToHop(): Computing local AIG has failed.");
    pHVar3 = (Hop_Obj_t *)0x0;
  }
  else {
    for (uVar5 = 0; uVar5 < (byte)(pIfObj->CutBest).field_0x1f; uVar5 = uVar5 + 1) {
      pIVar2 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar5 * 4));
      if (pIVar2 == (If_Obj_t *)0x0) break;
      (pIVar2->CutBest).Area = 0.0;
      (pIVar2->CutBest).Edge = 0.0;
    }
    for (i = 0; i < pIfMan->vTemp->nSize; i = i + 1) {
      puVar4 = (undefined8 *)Vec_PtrEntry(pIfMan->vTemp,i);
      *puVar4 = 0;
    }
  }
  return pHVar3;
}

Assistant:

Hop_Obj_t * Nwk_NodeIfToHop( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj )
{
    If_Cut_t * pCut;
    Hop_Obj_t * gFunc;
    If_Obj_t * pLeaf;
    int i;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetData( If_ObjCutBest(pLeaf), Hop_IthVar(pHopMan, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pIfMan->vTemp );
    gFunc = Nwk_NodeIfToHop2_rec( pHopMan, pIfMan, pIfObj, pIfMan->vTemp ); 
    if ( gFunc == (void *)1 )
    {
        printf( "Nwk_NodeIfToHop(): Computing local AIG has failed.\n" );
        return NULL;
    }
//    printf( "%d ", Vec_PtrSize(p->vTemp) );
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetData( If_ObjCutBest(pLeaf), NULL );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetData( pCut, NULL );
    return gFunc;
}